

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

TELEMETRY_MESSENGER_DISPOSITION_RESULT
get_messenger_message_disposition_result_from
          (DEVICE_MESSAGE_DISPOSITION_RESULT device_disposition_result)

{
  undefined8 in_RAX;
  undefined4 uVar2;
  LOGGER_LOG p_Var1;
  DEVICE_MESSAGE_DISPOSITION_RESULT DVar3;
  
  uVar2 = (undefined4)((ulong)in_RAX >> 0x20);
  DVar3 = device_disposition_result;
  if (DEVICE_MESSAGE_DISPOSITION_RESULT_RELEASED < device_disposition_result) {
    p_Var1 = xlogging_get_log_function();
    DVar3 = DEVICE_MESSAGE_DISPOSITION_RESULT_RELEASED;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"get_messenger_message_disposition_result_from",0x1a5,1,
                "Failed to get the corresponding TELEMETRY_MESSENGER_DISPOSITION_RESULT (%d is not supported)"
                ,CONCAT44(uVar2,device_disposition_result));
    }
  }
  return DVar3;
}

Assistant:

static TELEMETRY_MESSENGER_DISPOSITION_RESULT get_messenger_message_disposition_result_from(DEVICE_MESSAGE_DISPOSITION_RESULT device_disposition_result)
{
    TELEMETRY_MESSENGER_DISPOSITION_RESULT messenger_disposition_result;

    switch (device_disposition_result)
    {
        case DEVICE_MESSAGE_DISPOSITION_RESULT_NONE:
            messenger_disposition_result = TELEMETRY_MESSENGER_DISPOSITION_RESULT_NONE;
            break;
        case DEVICE_MESSAGE_DISPOSITION_RESULT_ACCEPTED:
            messenger_disposition_result = TELEMETRY_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
            break;
        case DEVICE_MESSAGE_DISPOSITION_RESULT_REJECTED:
            messenger_disposition_result = TELEMETRY_MESSENGER_DISPOSITION_RESULT_REJECTED;
            break;
        case DEVICE_MESSAGE_DISPOSITION_RESULT_RELEASED:
            messenger_disposition_result = TELEMETRY_MESSENGER_DISPOSITION_RESULT_RELEASED;
            break;
        default:
            LogError("Failed to get the corresponding TELEMETRY_MESSENGER_DISPOSITION_RESULT (%d is not supported)", device_disposition_result);
            messenger_disposition_result = TELEMETRY_MESSENGER_DISPOSITION_RESULT_RELEASED;
            break;
    }

    return messenger_disposition_result;
}